

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall TPZFMatrix<float>::TPZFMatrix(TPZFMatrix<float> *this,TPZVerySparseMatrix<float> *A)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  void *pvVar4;
  pointer ppVar5;
  TPZBaseMatrix *in_RSI;
  TPZRegisterClassId *in_RDI;
  pair<long,_long> *key;
  float *p;
  const_iterator end;
  const_iterator it;
  int64_t size;
  TPZVerySparseMatrix<float> *in_stack_ffffffffffffff48;
  _Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_float>_> *this_00;
  int iVar6;
  int64_t in_stack_ffffffffffffff58;
  _Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_float>_> *this_01;
  int64_t in_stack_ffffffffffffff60;
  long lVar7;
  void **in_stack_ffffffffffffff68;
  TPZManVector<int,_5> *in_stack_ffffffffffffff70;
  _Self local_48;
  _Self local_40;
  ulong local_38;
  undefined8 local_20;
  undefined8 local_18;
  TPZBaseMatrix *local_10;
  
  local_18 = 0;
  local_20 = 0x21;
  local_10 = in_RSI;
  TPZRegisterClassId::TPZRegisterClassId<TPZFMatrix<float>>(in_RDI,0x21);
  TPZBaseMatrix::Rows(local_10);
  TPZBaseMatrix::Cols(local_10);
  TPZMatrix<float>::TPZMatrix
            ((TPZMatrix<float> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  *(undefined ***)in_RDI = &PTR__TPZFMatrix_023ddb30;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  TPZManVector<int,_5>::TPZManVector(in_stack_ffffffffffffff70,(int64_t)in_stack_ffffffffffffff68);
  TPZVec<float>::TPZVec((TPZVec<float> *)(in_RDI + 0x70));
  local_38 = *(long *)(in_RDI + 8) * *(long *)(in_RDI + 0x10);
  if (local_38 != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_38;
    uVar3 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    *(void **)(in_RDI + 0x20) = pvVar4;
    local_40._M_node = (_Base_ptr)TPZVerySparseMatrix<float>::MapBegin(in_stack_ffffffffffffff48);
    local_48._M_node = (_Base_ptr)TPZVerySparseMatrix<float>::MapEnd(in_stack_ffffffffffffff48);
    memset(*(void **)(in_RDI + 0x20),0,local_38 << 2);
    while (bVar2 = std::operator!=(&local_40,&local_48), bVar2) {
      this_00 = &local_40;
      ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_float>_>::
               operator->(this_00);
      this_01 = (_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_float>_> *)
                (ppVar5->first).first;
      lVar7 = (ppVar5->first).second;
      ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_float>_>::
               operator->(this_00);
      iVar6 = (int)((ulong)this_00 >> 0x20);
      (**(code **)(*(long *)in_RDI + 0x118))(in_RDI,this_01,lVar7,&ppVar5->second);
      std::_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_float>_>::operator++
                (this_01,iVar6);
    }
  }
  return;
}

Assistant:

TPZFMatrix<TVar>::TPZFMatrix(TPZVerySparseMatrix <TVar> const & A)
: TPZRegisterClassId(&TPZFMatrix::ClassId),
TPZMatrix<TVar>( A.Rows(), A.Cols() ), fElem(0), fGiven(0), fSize(0) {
    
    int64_t size = this->fRow * this->fCol;
    if(!size) return;
    fElem = new TVar[ size ] ;
    
#ifdef PZDEBUG2
    if ( size && fElem == NULL ) Error( "Constructor <memory allocation error>." );
#endif
    
    typename std::map <std::pair<int64_t, int64_t>, TVar>::const_iterator it = A.MapBegin();
    typename std::map <std::pair<int64_t, int64_t>, TVar>::const_iterator end = A.MapEnd();
    
    TVar * p = fElem;
    memset((void *)p, 0, (size_t)size*sizeof(TVar));
    
    for (; it != end; it++) {
        const std::pair<int64_t, int64_t>& key = it->first;
        PutVal(key.first, key.second, it->second);
    }
    
}